

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lognormal_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::lognormal_dist<long_double>::cdf(lognormal_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *extraout_RAX;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  undefined2 in_MM0_Wa;
  double extraout_XMM0_Qa;
  longdouble in_stack_00000008;
  undefined6 in_stack_ffffffffffffffa2;
  
  if ((longdouble)0 < in_stack_00000008) {
    param_type::mu(in_RDI,in_RSI);
    math::ln((longdouble)
             CONCAT28(in_MM0_Wa,
                      CONCAT62(in_stack_ffffffffffffffa2,
                               (short)((unkuint10)in_stack_00000008 >> 0x40))));
    param_type::sigma(in_RDI,in_RSI);
    std::erfc(extraout_XMM0_Qa);
    in_RDI = extraout_RAX;
  }
  return in_RDI;
}

Assistant:

cdf(result_type x) const {
      if (x <= 0)
        return 0;
      return math::erfc(math::constants<result_type>::one_over_sqrt_2 * (P.mu() - math::ln(x)) /
                        P.sigma()) /
             2;
    }